

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O2

CordzStatistics * __thiscall
absl::lts_20250127::cord_internal::CordzInfo::GetCordzStatistics
          (CordzStatistics *__return_storage_ptr__,CordzInfo *this)

{
  size_t *psVar1;
  MethodIdentifier MVar2;
  uint uVar3;
  int iVar4;
  CordRepKind CVar5;
  CordRep *this_00;
  CordRepCrc *pCVar6;
  CordRep *pCVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  RepRef RVar10;
  CordRepAnalyzer analyzer;
  RepRef local_30;
  
  memset(__return_storage_ptr__,0,0x150);
  MVar2 = this->parent_method_;
  __return_storage_ptr__->method = this->method_;
  __return_storage_ptr__->parent_method = MVar2;
  CordzUpdateTracker::operator=(&__return_storage_ptr__->update_tracker,&this->update_tracker_);
  this_00 = RefCordRep(this);
  if (this_00 != (CordRep *)0x0) {
    __return_storage_ptr__->size = this_00->length;
    analyzer.memory_usage_.total = 0;
    analyzer.memory_usage_.fair_share = 0.0;
    uVar3 = (this_00->refcount).count_.super___atomic_base<int>._M_i >> 1;
    iVar4 = 1;
    if (1 < uVar3) {
      iVar4 = uVar3 - 1;
    }
    sVar8 = (size_t)iVar4;
    local_30.refcount = sVar8;
    local_30.rep = this_00;
    analyzer.statistics_ = __return_storage_ptr__;
    CVar5 = anon_unknown_16::CordRepAnalyzer::RepRef::tag(&local_30);
    pCVar7 = this_00;
    if (CVar5 == CRC) {
      (analyzer.statistics_)->node_count = (analyzer.statistics_)->node_count + 1;
      psVar1 = &((analyzer.statistics_)->node_counts).crc;
      *psVar1 = *psVar1 + 1;
      analyzer.memory_usage_.total = analyzer.memory_usage_.total + 0x20;
      auVar9._8_4_ = iVar4 >> 0x1f;
      auVar9._0_8_ = sVar8;
      auVar9._12_4_ = 0x45300000;
      analyzer.memory_usage_.fair_share =
           32.0 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,iVar4) - 4503599627370496.0)) +
           analyzer.memory_usage_.fair_share;
      pCVar6 = CordRep::crc(this_00);
      pCVar7 = pCVar6->child;
      if (pCVar7 == (CordRep *)0x0) {
        sVar8 = 0;
        pCVar7 = (CordRep *)0x0;
      }
      else {
        sVar8 = sVar8 * (long)((pCVar7->refcount).count_.super___atomic_base<int>._M_i >> 1);
      }
    }
    RVar10.refcount = sVar8;
    RVar10.rep = pCVar7;
    RVar10 = anon_unknown_16::CordRepAnalyzer::CountLinearReps
                       (&analyzer,RVar10,&analyzer.memory_usage_);
    local_30 = RVar10;
    CVar5 = anon_unknown_16::CordRepAnalyzer::RepRef::tag(&local_30);
    if (CVar5 == BTREE) {
      anon_unknown_16::CordRepAnalyzer::AnalyzeBtree(&analyzer,RVar10);
    }
    else {
      CVar5 = anon_unknown_16::CordRepAnalyzer::RepRef::tag(&local_30);
      if (CVar5 != UNUSED_0) {
        __assert_fail("false && \"repref.tag() == CordRepKind::UNUSED_0\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cordz_info.cc"
                      ,0x6a,
                      "auto absl::cord_internal::(anonymous namespace)::CordRepAnalyzer::AnalyzeCordRep(const CordRep *)::(anonymous class)::operator()() const"
                     );
      }
    }
    (analyzer.statistics_)->estimated_memory_usage =
         (analyzer.statistics_)->estimated_memory_usage + analyzer.memory_usage_.total;
    (analyzer.statistics_)->estimated_fair_share_memory_usage =
         (analyzer.statistics_)->estimated_fair_share_memory_usage +
         ((long)(analyzer.memory_usage_.fair_share - 9.223372036854776e+18) &
          (long)analyzer.memory_usage_.fair_share >> 0x3f | (long)analyzer.memory_usage_.fair_share)
    ;
    CordRep::Unref(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

CordzStatistics CordzInfo::GetCordzStatistics() const {
  CordzStatistics stats;
  stats.method = method_;
  stats.parent_method = parent_method_;
  stats.update_tracker = update_tracker_;
  if (CordRep* rep = RefCordRep()) {
    stats.size = rep->length;
    CordRepAnalyzer analyzer(stats);
    analyzer.AnalyzeCordRep(rep);
    CordRep::Unref(rep);
  }
  return stats;
}